

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O0

ze_result_t zeGetMemExpProcAddrTable(ze_api_version_t version,ze_mem_exp_dditable_t *pDdiTable)

{
  ze_api_version_t *pzVar1;
  ze_result_t result;
  ze_mem_exp_dditable_t *dditable;
  ze_mem_exp_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  pzVar1 = validation_layer::context;
  if (pDdiTable == (ze_mem_exp_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (((int)*validation_layer::context >> 0x10 == (int)version >> 0x10) &&
          ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
    *(ze_pfnMemGetIpcHandleFromFileDescriptorExp_t *)(validation_layer::context + 0x106) =
         pDdiTable->pfnGetIpcHandleFromFileDescriptorExp;
    pDdiTable->pfnGetIpcHandleFromFileDescriptorExp =
         validation_layer::zeMemGetIpcHandleFromFileDescriptorExp;
    *(ze_pfnMemGetFileDescriptorFromIpcHandleExp_t *)(pzVar1 + 0x108) =
         pDdiTable->pfnGetFileDescriptorFromIpcHandleExp;
    pDdiTable->pfnGetFileDescriptorFromIpcHandleExp =
         validation_layer::zeMemGetFileDescriptorFromIpcHandleExp;
    *(ze_pfnMemSetAtomicAccessAttributeExp_t *)(pzVar1 + 0x10a) =
         pDdiTable->pfnSetAtomicAccessAttributeExp;
    pDdiTable->pfnSetAtomicAccessAttributeExp = validation_layer::zeMemSetAtomicAccessAttributeExp;
    *(ze_pfnMemGetAtomicAccessAttributeExp_t *)(pzVar1 + 0x10c) =
         pDdiTable->pfnGetAtomicAccessAttributeExp;
    pDdiTable->pfnGetAtomicAccessAttributeExp = validation_layer::zeMemGetAtomicAccessAttributeExp;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetMemExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_mem_exp_dditable_t* pDdiTable                ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zeDdiTable.MemExp;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetIpcHandleFromFileDescriptorExp        = pDdiTable->pfnGetIpcHandleFromFileDescriptorExp;
    pDdiTable->pfnGetIpcHandleFromFileDescriptorExp      = validation_layer::zeMemGetIpcHandleFromFileDescriptorExp;

    dditable.pfnGetFileDescriptorFromIpcHandleExp        = pDdiTable->pfnGetFileDescriptorFromIpcHandleExp;
    pDdiTable->pfnGetFileDescriptorFromIpcHandleExp      = validation_layer::zeMemGetFileDescriptorFromIpcHandleExp;

    dditable.pfnSetAtomicAccessAttributeExp              = pDdiTable->pfnSetAtomicAccessAttributeExp;
    pDdiTable->pfnSetAtomicAccessAttributeExp            = validation_layer::zeMemSetAtomicAccessAttributeExp;

    dditable.pfnGetAtomicAccessAttributeExp              = pDdiTable->pfnGetAtomicAccessAttributeExp;
    pDdiTable->pfnGetAtomicAccessAttributeExp            = validation_layer::zeMemGetAtomicAccessAttributeExp;

    return result;
}